

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O2

int aom_film_grain_table_lookup
              (aom_film_grain_table_t *t,int64_t time_stamp,int64_t end_time,int erase,
              aom_film_grain_t *grain)

{
  uint16_t uVar1;
  long lVar2;
  bool bVar3;
  aom_film_grain_table_entry_t *paVar4;
  bool bVar5;
  aom_film_grain_table_entry_t *paVar6;
  aom_film_grain_table_t *paVar7;
  aom_film_grain_table_entry_t *paVar8;
  aom_film_grain_table_entry_t *__src;
  int iVar9;
  bool bVar10;
  
  bVar10 = erase == 0;
  bVar5 = false;
  do {
    bVar3 = bVar5;
    paVar8 = t->head;
    if (grain == (aom_film_grain_t *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = grain->random_seed;
      memset(grain,0,0x288);
    }
    paVar4 = (aom_film_grain_table_entry_t *)0x0;
    do {
      __src = paVar8;
      paVar6 = paVar4;
      iVar9 = 0;
      if (__src == (aom_film_grain_table_entry_t *)0x0) goto LAB_0025b3d4;
      paVar4 = __src;
      paVar8 = __src->next;
    } while ((time_stamp < __src->start_time) || (__src->end_time <= time_stamp));
    if ((grain != (aom_film_grain_t *)0x0) && (memcpy(grain,__src,0x288), time_stamp != 0)) {
      grain->random_seed = uVar1;
    }
    if (bVar10) break;
    lVar2 = __src->end_time;
    if (end_time < lVar2 || __src->start_time < time_stamp) {
      if (__src->start_time < time_stamp) {
        if (end_time < lVar2) {
LAB_0025b34f:
          paVar8 = (aom_film_grain_table_entry_t *)aom_malloc(0x2a0);
          if (paVar8 == (aom_film_grain_table_entry_t *)0x0) goto LAB_0025b3d4;
          paVar8->next = __src->next;
          paVar8->start_time = end_time;
          paVar8->end_time = __src->end_time;
          memcpy(paVar8,__src,0x288);
          __src->next = paVar8;
          __src->end_time = time_stamp;
          if (t->tail == __src) {
            t->tail = paVar8;
          }
        }
        else {
          __src->end_time = time_stamp;
        }
      }
      else {
        if (lVar2 <= end_time) goto LAB_0025b34f;
        __src->start_time = end_time;
      }
    }
    else {
      if (t->tail == __src) {
        t->tail = paVar6;
      }
      paVar7 = (aom_film_grain_table_t *)&paVar6->next;
      if (paVar6 == (aom_film_grain_table_entry_t *)0x0) {
        paVar7 = t;
      }
      paVar7->head = __src->next;
      aom_free(__src);
    }
    bVar10 = false;
    grain = (aom_film_grain_t *)0x0;
    time_stamp = lVar2;
    bVar5 = true;
  } while (lVar2 < end_time);
  iVar9 = 1;
LAB_0025b3d4:
  if (bVar3) {
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int aom_film_grain_table_lookup(aom_film_grain_table_t *t, int64_t time_stamp,
                                int64_t end_time, int erase,
                                aom_film_grain_t *grain) {
  aom_film_grain_table_entry_t *entry = t->head;
  aom_film_grain_table_entry_t *prev_entry = NULL;
  uint16_t random_seed = grain ? grain->random_seed : 0;
  if (grain) memset(grain, 0, sizeof(*grain));

  while (entry) {
    aom_film_grain_table_entry_t *next = entry->next;
    if (time_stamp >= entry->start_time && time_stamp < entry->end_time) {
      if (grain) {
        *grain = entry->params;
        if (time_stamp != 0) grain->random_seed = random_seed;
      }
      if (!erase) return 1;

      const int64_t entry_end_time = entry->end_time;
      if (time_stamp <= entry->start_time && end_time >= entry->end_time) {
        if (t->tail == entry) t->tail = prev_entry;
        if (prev_entry) {
          prev_entry->next = entry->next;
        } else {
          t->head = entry->next;
        }
        aom_free(entry);
      } else if (time_stamp <= entry->start_time &&
                 end_time < entry->end_time) {
        entry->start_time = end_time;
      } else if (time_stamp > entry->start_time &&
                 end_time >= entry->end_time) {
        entry->end_time = time_stamp;
      } else {
        aom_film_grain_table_entry_t *new_entry =
            aom_malloc(sizeof(*new_entry));
        if (!new_entry) return 0;
        new_entry->next = entry->next;
        new_entry->start_time = end_time;
        new_entry->end_time = entry->end_time;
        new_entry->params = entry->params;
        entry->next = new_entry;
        entry->end_time = time_stamp;
        if (t->tail == entry) t->tail = new_entry;
      }
      // If segments aren't aligned, delete from the beginning of subsequent
      // segments
      if (end_time > entry_end_time) {
        // Ignoring the return value here is safe since we're erasing from the
        // beginning of subsequent entries.
        aom_film_grain_table_lookup(t, entry_end_time, end_time, /*erase=*/1,
                                    NULL);
      }
      return 1;
    }
    prev_entry = entry;
    entry = next;
  }
  return 0;
}